

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

uint64_t uv__get_cgroup_constrained_memory(char *buf)

{
  int iVar1;
  char *local_30;
  char *local_28;
  uint64_t max;
  uint64_t high;
  char *buf_local;
  
  high = (uint64_t)buf;
  iVar1 = strncmp(buf,"0::/",4);
  if (iVar1 == 0) {
    uv__get_cgroup2_memory_limits((char *)high,&max,(uint64_t *)&local_28);
  }
  else {
    uv__get_cgroup1_memory_limits((char *)high,&max,(uint64_t *)&local_28);
  }
  if ((max == 0) || (local_28 == (char *)0x0)) {
    buf_local = (char *)0x0;
  }
  else {
    if (max < local_28) {
      local_30 = (char *)max;
    }
    else {
      local_30 = local_28;
    }
    buf_local = local_30;
  }
  return (uint64_t)buf_local;
}

Assistant:

static uint64_t uv__get_cgroup_constrained_memory(char buf[static 1024]) {
  uint64_t high;
  uint64_t max;

  /* In the case of cgroupv2, we'll only have a single entry. */
  if (strncmp(buf, "0::/", 4))
    uv__get_cgroup1_memory_limits(buf, &high, &max);
  else
    uv__get_cgroup2_memory_limits(buf, &high, &max);

  if (high == 0 || max == 0)
    return 0;

  return high < max ? high : max;
}